

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O3

void __thiscall
gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::clear
          (BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  pointer pAVar1;
  pointer pAVar2;
  int iVar3;
  pointer pAVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_pullLock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  pAVar1 = (this->pullElements).
           super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl
           .super__Vector_impl_data._M_start;
  pAVar2 = (this->pullElements).
           super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pAVar4 = pAVar1;
  if (pAVar2 != pAVar1) {
    do {
      helics::ActionMessage::~ActionMessage(pAVar4);
      pAVar4 = pAVar4 + 1;
    } while (pAVar4 != pAVar2);
    (this->pullElements).
    super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar1;
  }
  pAVar1 = (this->pushElements).
           super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl
           .super__Vector_impl_data._M_start;
  pAVar2 = (this->pushElements).
           super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pAVar4 = pAVar1;
  if (pAVar2 != pAVar1) {
    do {
      helics::ActionMessage::~ActionMessage(pAVar4);
      pAVar4 = pAVar4 + 1;
    } while (pAVar4 != pAVar2);
    (this->pushElements).
    super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar1;
  }
  LOCK();
  (this->queueEmptyFlag)._M_base._M_i = true;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
  return;
}

Assistant:

void clear()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            pullElements.clear();
            pushElements.clear();
            queueEmptyFlag = true;
        }